

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Validity * __thiscall
capnp::compiler::CompilerMain::convert(Validity *__return_storage_ptr__,CompilerMain *this)

{
  Format format;
  int iVar1;
  Validity *result;
  ArrayPtr<const_unsigned_char> AVar2;
  FdOutputStream output;
  FdInputStream rawInput;
  BufferedInputStreamWrapper input;
  FdOutputStream local_a8;
  Validity local_98;
  FdInputStream local_78;
  BufferedInputStreamWrapper local_68;
  
  verifyRequirements(__return_storage_ptr__,this,this->convertFrom);
  if (((__return_storage_ptr__->errorMessage).ptr.isSet == false) &&
     (verifyRequirements(__return_storage_ptr__,this,this->convertTo),
     (__return_storage_ptr__->errorMessage).ptr.isSet == false)) {
    local_78.super_InputStream._vptr_InputStream = (_func_int **)&PTR__FdInputStream_00280580;
    local_78.fd = 0;
    local_78.autoclose.fd = -1;
    kj::BufferedInputStreamWrapper::BufferedInputStreamWrapper
              (&local_68,&local_78.super_InputStream,(ArrayPtr<unsigned_char>)ZEXT816(0));
    local_a8.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__FdOutputStream_002805b0;
    local_a8.fd = 1;
    local_a8.autoclose.fd = -1;
    if (this->quiet == false) {
      format = this->convertFrom;
      AVar2 = kj::BufferedInputStream::getReadBuffer(&local_68.super_BufferedInputStream);
      checkPlausibility(&local_98,this,format,AVar2);
      if (local_98.errorMessage.ptr.isSet != false) {
        (__return_storage_ptr__->errorMessage).ptr.isSet = local_98.errorMessage.ptr.isSet;
        (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.ptr =
             local_98.errorMessage.ptr.field_1.value.content.ptr;
        (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.size_ =
             local_98.errorMessage.ptr.field_1.value.content.size_;
        (__return_storage_ptr__->errorMessage).ptr.field_1.value.content.disposer =
             local_98.errorMessage.ptr.field_1.value.content.disposer;
        kj::FdOutputStream::~FdOutputStream(&local_a8);
        kj::BufferedInputStreamWrapper::~BufferedInputStreamWrapper(&local_68);
        kj::FdInputStream::~FdInputStream(&local_78);
        return __return_storage_ptr__;
      }
      kj::MainBuilder::Validity::~Validity(&local_98);
    }
    while (AVar2 = kj::BufferedInputStreamWrapper::tryGetReadBuffer(&local_68), AVar2.size_ != 0) {
      readOneAndConvert(this,&local_68,&local_a8.super_OutputStream);
    }
    iVar1 = (*this->context->_vptr_ProcessContext[1])();
    kj::FdOutputStream::~FdOutputStream(&local_a8);
    kj::BufferedInputStreamWrapper::~BufferedInputStreamWrapper(&local_68);
    kj::FdInputStream::~FdInputStream(&local_78);
    _Unwind_Resume(iVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity convert() {
    {
      auto result = verifyRequirements(convertFrom);
      if (result.getError() != kj::none) return result;
    }
    {
      auto result = verifyRequirements(convertTo);
      if (result.getError() != kj::none) return result;
    }

    kj::FdInputStream rawInput(STDIN_FILENO);
    kj::BufferedInputStreamWrapper input(rawInput);

    kj::FdOutputStream output(STDOUT_FILENO);

    if (!quiet) {
      auto result = checkPlausibility(convertFrom, input.getReadBuffer());
      if (result.getError() != kj::none) {
        return kj::mv(result);
      }
    }

    while (input.tryGetReadBuffer().size() > 0) {
      readOneAndConvert(input, output);
    }

    context.exit();
    KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT;
  }